

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O1

vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *
libtorrent::anon_unknown_40::convert_file_storage
          (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
           *__return_storage_ptr__,file_storage *fs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  file_flags_t fVar3;
  int iVar4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar5;
  int64_t iVar6;
  string *__args_4;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  file_index_t index;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_109;
  vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *local_108;
  string local_100;
  int local_dc;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  uint7 uStack_c7;
  undefined8 uStack_c0;
  string local_b8;
  create_file_entry local_98;
  ulong local_40;
  time_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = file_storage::num_files(fs);
  local_108 = (vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *
              )__return_storage_ptr__;
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  reserve(__return_storage_ptr__,(long)iVar4);
  iVar5 = file_storage::file_range(fs);
  local_40 = (ulong)iVar5 >> 0x20;
  if (iVar5._begin.m_val.m_val != iVar5._end.m_val.m_val) {
    paVar1 = &local_b8.field_2;
    do {
      index.m_val = (int)iVar5._begin.m_val;
      fVar3 = file_storage::file_flags(fs,index);
      if ((fVar3.m_val & 8) == 0) {
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
        file_storage::file_path(&local_b8,fs,index,&local_100);
        iVar6 = file_storage::file_size(fs,index);
        fVar3 = file_storage::file_flags(fs,index);
        local_98.mtime = file_storage::mtime(fs,index);
        local_98.filename._M_dataplus._M_p = (pointer)&local_98.filename.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar1) {
          local_98.filename.field_2._8_8_ = local_b8.field_2._8_8_;
        }
        else {
          local_98.filename._M_dataplus._M_p = local_b8._M_dataplus._M_p;
        }
        local_98.filename.field_2._M_allocated_capacity._1_7_ =
             local_b8.field_2._M_allocated_capacity._1_7_;
        local_98.filename.field_2._M_local_buf[0] = local_b8.field_2._M_local_buf[0];
        local_98.filename._M_string_length = local_b8._M_string_length;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        paVar2 = &local_98.symlink.field_2;
        local_d8 = &local_c8;
        local_98.symlink.field_2._M_allocated_capacity = (ulong)uStack_c7 << 8;
        local_98.symlink.field_2._8_8_ = uStack_c0;
        local_98.symlink._M_string_length = 0;
        local_d0 = 0;
        local_c8 = 0;
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        local_98.size = iVar6;
        local_98.flags = fVar3;
        local_98.symlink._M_dataplus._M_p = (pointer)paVar2;
        ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
        ::emplace_back<libtorrent::create_file_entry>
                  ((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    *)local_108,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.symlink._M_dataplus._M_p != paVar2) {
          operator_delete(local_98.symlink._M_dataplus._M_p,
                          local_98.symlink.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.filename._M_dataplus._M_p != &local_98.filename.field_2) {
          operator_delete(local_98.filename._M_dataplus._M_p,
                          local_98.filename.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          uVar7 = CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                           local_b8.field_2._M_local_buf[0]);
          _Var8._M_p = local_b8._M_dataplus._M_p;
LAB_0019a9f5:
          operator_delete(_Var8._M_p,uVar7 + 1);
        }
      }
      else {
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
        file_storage::file_path(&local_98.filename,fs,index,&local_100);
        local_dc = 0;
        local_109.m_val = (uchar)file_storage::file_flags(fs,index);
        local_38 = file_storage::mtime(fs,index);
        __args_4 = file_storage::internal_symlink_abi_cxx11_(fs,index);
        ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>::
        emplace_back<std::__cxx11::string,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>,long,std::__cxx11::string_const&>
                  (local_108,&local_98.filename,&local_dc,&local_109,&local_38,__args_4);
        uVar7 = local_98.filename.field_2._M_allocated_capacity;
        _Var8._M_p = local_98.filename._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.filename._M_dataplus._M_p != &local_98.filename.field_2) goto LAB_0019a9f5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      iVar5._begin.m_val = index.m_val + 1;
      iVar5._end.m_val = 0;
    } while ((uint)local_40 != iVar5._begin.m_val);
  }
  return (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *)
         local_108;
}

Assistant:

std::vector<create_file_entry> convert_file_storage(file_storage const& fs)
	{
		std::vector<create_file_entry> ret;
		ret.reserve(static_cast<std::size_t>(fs.num_files()));
		for (auto const i : fs.file_range())
		{
			if (fs.file_flags(i) & file_storage::flag_symlink)
				ret.emplace_back(fs.file_path(i), 0, fs.file_flags(i), fs.mtime(i), fs.internal_symlink(i));
			else
				ret.push_back({fs.file_path(i), fs.file_size(i), fs.file_flags(i), fs.mtime(i), {}});
		}
		return ret;
	}